

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_reroll_item(command *cmd)

{
  bitflag bVar1;
  uint16_t uVar2;
  object *poVar3;
  loc lVar4;
  _Bool _Var5;
  wchar_t wVar6;
  bool good;
  wchar_t roll_choice;
  object *obj;
  object *new;
  wchar_t update;
  wchar_t local_64;
  object *local_60;
  object *local_58;
  int local_4c;
  object *local_48;
  object *poStack_40;
  
  local_64 = L'\0';
  local_4c = 0;
  wVar6 = cmd_get_arg_item((command_conflict *)cmd,"item",&local_60);
  if (wVar6 != L'\0') {
    _Var5 = get_item(&local_60,"Reroll which item? ","You have nothing to reroll.",cmd->code,
                     (item_tester)0x0,L'\x0f');
    if (!_Var5) {
      return;
    }
    cmd_set_arg_item((command_conflict *)cmd,"item",local_60);
  }
  wVar6 = cmd_get_arg_choice((command_conflict *)cmd,"choice",&local_64);
  if (wVar6 != L'\0') {
    _Var5 = get_com("Roll as [n]ormal, [g]ood, or [e]xcellent? ",(char *)&local_58);
    if (!_Var5) {
      return;
    }
    local_58._0_1_ = (byte)local_58 & 0xdf;
    if ((byte)local_58 == 0x45) {
      local_64 = L'\x02';
    }
    else if ((byte)local_58 == 0x47) {
      local_64 = L'\x01';
    }
    else {
      if ((byte)local_58 != 0x4e) {
        return;
      }
      local_64 = L'\0';
    }
    cmd_set_arg_choice((command_conflict *)cmd,"choice",local_64);
  }
  if ((local_64 == L'\0') || (local_64 == L'\x01')) {
    _Var5 = false;
  }
  else {
    if (local_64 != L'\x02') {
      return;
    }
    _Var5 = true;
  }
  if (local_60->artifact == (artifact *)0x0) {
    good = local_64 != L'\0';
    local_58 = object_new();
    object_prep(local_58,local_60->kind,(int)player->depth,RANDOMISE);
    apply_magic(local_58,(int)player->depth,false,good,_Var5,false);
    local_48 = local_60->prev;
    poStack_40 = local_60->next;
    poVar3 = local_60->known;
    uVar2 = local_60->oidx;
    lVar4 = local_60->grid;
    bVar1 = local_60->notice;
    mem_free(local_60->slays);
    local_60->slays = (_Bool *)0x0;
    mem_free(local_60->brands);
    local_60->brands = (_Bool *)0x0;
    mem_free(local_60->curses);
    local_60->curses = (curse_data *)0x0;
    object_copy(local_60,local_58);
    local_60->prev = local_48;
    local_60->next = poStack_40;
    local_60->known = poVar3;
    poVar3->ego = local_60->ego;
    local_60->oidx = uVar2;
    local_60->grid = lVar4;
    local_60->notice = bVar1;
    local_60->origin = '\x13';
    wVar6 = cmd_get_arg_choice((command_conflict *)cmd,"update",&local_4c);
    if (wVar6 == L'\0' && local_4c == 0) {
      wiz_play_item_notify_changed();
    }
    else {
      wiz_play_item_standard_upkeep(player,local_60);
    }
    object_delete((chunk *)cave,(chunk *)player->cave,&local_58);
  }
  return;
}

Assistant:

void do_cmd_wiz_reroll_item(struct command *cmd)
{
	bool good = false;
	bool great = false;
	int roll_choice = 0;
	int update = 0;
	struct object *obj;
	struct object *new;

	/* Get the item to reroll. */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) {
		if (!get_item(&obj, "Reroll which item? ",
				"You have nothing to reroll.", cmd->code,
				NULL, (USE_EQUIP | USE_INVEN | USE_QUIVER |
				USE_FLOOR))) {
			return;
		}
		cmd_set_arg_item(cmd, "item", obj);
	}

	/* Get the type of roll to use. */
	if (cmd_get_arg_choice(cmd, "choice", &roll_choice) != CMD_OK) {
		char ch;

		if (!get_com("Roll as [n]ormal, [g]ood, or [e]xcellent? ", &ch)) {
			return;
		}
		if (ch == 'n' || ch == 'N') {
			roll_choice = 0;
		} else if (ch == 'g' || ch == 'G') {
			roll_choice = 1;
		} else if (ch == 'e' || ch == 'E') {
			roll_choice = 2;
		} else {
			return;
		}
		cmd_set_arg_choice(cmd, "choice", roll_choice);
	}
	if (roll_choice == 0) {
		good = false;
		great = false;
	} else if (roll_choice == 1) {
		good = true;
		great = false;
	} else if (roll_choice == 2) {
		good = true;
		great = true;
	} else {
		return;
	}

	/* Hack -- leave artifacts alone */
	if (obj->artifact) {
		return;
	}

	/* Get a new object with a clean slate. */
	new = object_new();

	/* Reroll based on old kind and player's depth.  Then apply magic. */
	object_prep(new, obj->kind, player->depth, RANDOMISE);
	apply_magic(new, player->depth, false, good, great, false);

	/* Copy over changes to the original. */
	{
		/* Record old pile information. */
		struct object *prev = obj->prev;
		struct object *next = obj->next;
		struct object *known_obj = obj->known;
		uint16_t oidx = obj->oidx;
		struct loc grid = obj->grid;
		bitflag notice = obj->notice;

		/* Free slays, brands, and curses on the old object by hand. */
		mem_free(obj->slays);
		obj->slays = NULL;
		mem_free(obj->brands);
		obj->brands = NULL;
		mem_free(obj->curses);
		obj->curses = NULL;

		/* Copy over; pile information needs to be restored. */
		object_copy(obj, new);
		obj->prev = prev;
		obj->next = next;
		obj->known = known_obj;
		obj->known->ego = obj->ego;
		obj->oidx = oidx;
		obj->grid = grid;
		obj->notice = notice;
	}

	/* Mark as cheat */
	obj->origin = ORIGIN_CHEAT;

	/* Flag what needs to be updated. */
	if (cmd_get_arg_choice(cmd, "update", &update) != CMD_OK || update) {
		wiz_play_item_standard_upkeep(player, obj);
	} else {
		wiz_play_item_notify_changed();
	}

	/* Free the copy. */
	object_delete(cave, player->cave, &new);
}